

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmPageTableMgr.cpp
# Opt level: O3

GMM_PAGETABLEPool * __thiscall
GmmLib::GmmPageTableMgr::__GetFreePoolNode
          (GmmPageTableMgr *this,uint32_t *FreePoolNodeIdx,POOL_TYPE PoolType)

{
  int iVar1;
  int iVar2;
  uint32_t uVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  GmmPageTablePool *pGVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  
  if (this->AuxTTObj != (AuxTable *)0x0) {
    pthread_mutex_lock((pthread_mutex_t *)&this->PoolLock);
  }
  pGVar4 = this->pPool;
  iVar1 = 1;
  uVar6 = 0x20;
  if (PoolType != POOL_TYPE_TRTTL2) {
    if (pGVar4 == (GMM_PAGETABLEPool *)0x0) {
      pGVar4 = (GmmPageTablePool *)0x0;
    }
    else {
      pGVar4 = pGVar4->NextPool;
    }
    if (PoolType != POOL_TYPE_TRTTL1) {
      if (PoolType == POOL_TYPE_AUXTTL2) {
        iVar1 = 8;
        uVar6 = 0x100;
      }
      else {
        iVar1 = (*this->pClientContext->_vptr_GmmClientContext[3])();
        uVar6 = 0x40;
        if (CONCAT44(extraout_var,iVar1) != 0) {
          iVar1 = (*this->pClientContext->_vptr_GmmClientContext[3])();
          if ((*(ulong *)(CONCAT44(extraout_var_00,iVar1) + 0x40) & 0x800000000000) == 0) {
            iVar1 = (*this->pClientContext->_vptr_GmmClientContext[3])();
            uVar6 = (uint)((*(byte *)(CONCAT44(extraout_var_01,iVar1) + 0x45) & 0x40) >> 6) * 0x20 +
                    0x20;
          }
        }
        iVar2 = (*this->pClientContext->_vptr_GmmClientContext[3])();
        iVar1 = 2;
        if (CONCAT44(extraout_var_02,iVar2) != 0) {
          iVar1 = (*this->pClientContext->_vptr_GmmClientContext[3])();
          if ((*(ulong *)(CONCAT44(extraout_var_03,iVar1) + 0x40) & 0x800000000000) == 0) {
            iVar1 = (*this->pClientContext->_vptr_GmmClientContext[3])();
            iVar1 = 2 - (uint)((*(byte *)(CONCAT44(extraout_var_04,iVar1) + 0x45) & 0x40) == 0);
          }
          else {
            iVar1 = 2;
          }
        }
      }
    }
  }
  if ((pGVar4 != (GMM_PAGETABLEPool *)0x0) &&
     (uVar5 = (uint)(PoolType != POOL_TYPE_TRTTL2),
     (uint)(PoolType != POOL_TYPE_TRTTL2) < this->NumNodePoolElements)) {
    uVar7 = 0;
    do {
      if ((0 < pGVar4->NumFreeNodes) && (pGVar4->PoolType == PoolType)) {
        *FreePoolNodeIdx = 0;
        if ((uint)(0x200 / (ulong)uVar6) <= (uint)uVar7) goto LAB_001b74f4;
        uVar7 = uVar7 & 0xffffffff;
        uVar3 = 0;
        do {
          if (pGVar4->NodeUsage[uVar7] != 0xffffffff) {
            uVar6 = ~pGVar4->NodeUsage[uVar7];
            iVar2 = 0;
            if (uVar6 != 0) {
              for (; (uVar6 >> iVar2 & 1) == 0; iVar2 = iVar2 + 1) {
              }
            }
            *FreePoolNodeIdx = iVar2 * iVar1 + uVar3;
            goto LAB_001b74f4;
          }
          uVar3 = uVar3 + uVar6;
          *FreePoolNodeIdx = uVar3;
          uVar7 = uVar7 + 1;
        } while (uVar7 < 0x200 / (ulong)uVar6);
      }
      pGVar4 = pGVar4->NextPool;
    } while ((pGVar4 != (GmmPageTablePool *)0x0) &&
            (uVar5 = uVar5 + 1, uVar5 < this->NumNodePoolElements));
  }
  pGVar4 = __AllocateNodePool(this,iVar1 << 0xc,PoolType);
  if (pGVar4 == (GMM_PAGETABLEPool *)0x0) {
    pGVar4 = (GMM_PAGETABLEPool *)0x0;
  }
  else {
    *FreePoolNodeIdx = 0;
  }
LAB_001b74f4:
  if (this->AuxTTObj != (AuxTable *)0x0) {
    pthread_mutex_unlock((pthread_mutex_t *)&this->PoolLock);
  }
  return pGVar4;
}

Assistant:

GmmLib::GMM_PAGETABLEPool *GmmLib::GmmPageTableMgr::__GetFreePoolNode(uint32_t *FreePoolNodeIdx, POOL_TYPE PoolType)
{
    uint32_t PoolNode = -1, i = 0, j = 0, DWdivisor = 1, IdxMultiplier = 1;
    bool     PoolNodeFound = false, TRTTPool = false;

    ENTER_CRITICAL_SECTION
    GmmLib::GMM_PAGETABLEPool *Pool = pPool;

    Pool = (PoolType == POOL_TYPE_TRTTL2) ? Pool : //1st pool reserved for TRTT-L2, since TRTT-L2 pruning not supported yet,
           (Pool ? Pool->GetNextPool() : NULL);    //other pools can be TR-L1/Aux-L1/Aux-L2 (and support dynamic pruning)
    TRTTPool      = (PoolType == POOL_TYPE_TRTTL2 || PoolType == POOL_TYPE_TRTTL1) ? true : false;
    DWdivisor     = TRTTPool ? 8 * sizeof(uint32_t) : (PoolType == POOL_TYPE_AUXTTL2) ? 8 * sizeof(uint32_t) * AUX_L2TABLE_SIZE_IN_POOLNODES : 8 * sizeof(uint32_t) * AUX_L1TABLE_SIZE_IN_POOLNODES_2(GetLibContext());
    IdxMultiplier = TRTTPool ? 1 : (PoolType == POOL_TYPE_AUXTTL2) ? AUX_L2TABLE_SIZE_IN_POOLNODES : AUX_L1TABLE_SIZE_IN_POOLNODES_2(GetLibContext());
    //Scan existing PageTablePools for free pool node
    for(i = (PoolType == POOL_TYPE_TRTTL2) ? 0 : 1; Pool && i < NumNodePoolElements; i++)
    {
        if(Pool->GetNumFreeNode() > 0 && Pool->GetPoolType() == PoolType)
        {
            PoolNodeFound    = true;
            *FreePoolNodeIdx = 0;
            for(; j < PAGETABLE_POOL_MAX_NODES / DWdivisor; j++)
            {
                if(_BitScanForward((uint32_t *)&PoolNode, (uint32_t) ~(Pool->GetNodeUsageAtIndex(j)))) // Get LSB that has value 0
                {
                    *FreePoolNodeIdx += PoolNode * IdxMultiplier;
                    PoolNodeFound = true;
                    break;
                }
                PoolNodeFound = false;
                *FreePoolNodeIdx += DWdivisor; //DWORD size in bits
            }
        }
        if(PoolNodeFound)
        {
            __GMM_ASSERT(Pool->GetPoolType() == PoolType);
            EXIT_CRITICAL_SECTION
            return Pool;
        }
        Pool = Pool->GetNextPool();
    }

    //No free pool node, allocate new
    if(!PoolNodeFound)
    {
        GMM_PAGETABLEPool *Pool = NULL;
        if(Pool = __AllocateNodePool(IdxMultiplier * PAGE_SIZE, PoolType))
        {
            __GMM_ASSERT(Pool->GetPoolType() == PoolType);

            *FreePoolNodeIdx = 0;
            EXIT_CRITICAL_SECTION
            return Pool;
        }
    }

    EXIT_CRITICAL_SECTION
    return NULL;
}